

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iniparser.c
# Opt level: O0

int iniparser_getsecnkeys(dictionary *d,char *s)

{
  int iVar1;
  size_t sVar2;
  int local_43c;
  char local_438 [4];
  int j;
  char keym [1025];
  int local_28;
  int nkeys;
  int seclen;
  char *s_local;
  dictionary *d_local;
  
  local_28 = 0;
  if (d == (dictionary *)0x0) {
    d_local._4_4_ = 0;
  }
  else {
    iVar1 = iniparser_find_entry(d,s);
    if (iVar1 == 0) {
      d_local._4_4_ = 0;
    }
    else {
      sVar2 = strlen(s);
      sprintf(local_438,"%s:",s);
      for (local_43c = 0; (long)local_43c < d->size; local_43c = local_43c + 1) {
        if ((d->key[local_43c] != (char *)0x0) &&
           (iVar1 = strncmp(d->key[local_43c],local_438,(long)((int)sVar2 + 1)), iVar1 == 0)) {
          local_28 = local_28 + 1;
        }
      }
      d_local._4_4_ = local_28;
    }
  }
  return d_local._4_4_;
}

Assistant:

int iniparser_getsecnkeys(const dictionary * d, const char * s)
{
    int     seclen, nkeys ;
    char    keym[ASCIILINESZ+1];
    int j ;

    nkeys = 0;

    if (d==NULL) return nkeys;
    if (! iniparser_find_entry(d, s)) return nkeys;

    seclen  = (int)strlen(s);
    sprintf(keym, "%s:", s);

    for (j=0 ; j<d->size ; j++) {
        if (d->key[j]==NULL)
            continue ;
        if (!strncmp(d->key[j], keym, seclen+1))
            nkeys++;
    }

    return nkeys;

}